

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void __thiscall wallet::CWalletTx::CWalletTx(CWalletTx *this,CTransactionRef *tx,TxState *state)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  CWalletTx *in_stack_ffffffffffffff88;
  long local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&in_stack_ffffffffffffff88->mapValue);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)in_stack_ffffffffffffff88);
  std::_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_long,_wallet::CWalletTx_*>_> *)
             in_stack_ffffffffffffff88);
  local_38 = in_RDI + 0x68;
  do {
    CachableAmount::CachableAmount((CachableAmount *)in_stack_ffffffffffffff88);
    local_38 = local_38 + 0x48;
  } while (local_38 != in_RDI + 0x188);
  *(undefined1 *)(in_RDI + 0x188) = 1;
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff88,
             (shared_ptr<const_CTransaction> *)0xd8eb50);
  uVar2 = *in_RDX;
  uVar3 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar5 = in_RDX[3];
  uVar6 = *(undefined8 *)((long)in_RDX + 0x24);
  *(undefined8 *)(in_RDI + 0x1c4) = *(undefined8 *)((long)in_RDX + 0x1c);
  *(undefined8 *)(in_RDI + 0x1cc) = uVar6;
  *(undefined8 *)(in_RDI + 0x1b8) = uVar4;
  *(undefined8 *)(in_RDI + 0x1c0) = uVar5;
  *(undefined8 *)(in_RDI + 0x1a8) = uVar2;
  *(undefined8 *)(in_RDI + 0x1b0) = uVar3;
  std::
  set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
  ::set((set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
         *)in_stack_ffffffffffffff88);
  Init(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CWalletTx(CTransactionRef tx, const TxState& state) : tx(std::move(tx)), m_state(state)
    {
        Init();
    }